

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void compact_int64_suite::test_array64_int64_two(void)

{
  value vVar1;
  value_type expected [16];
  decoder decoder;
  value_type input [25];
  value local_8c;
  value local_88 [4];
  undefined1 local_78 [4];
  undefined4 local_74;
  decoder local_70;
  uchar local_48 [32];
  
  local_70.input._M_str = local_48;
  local_48[0x10] = 0x88;
  local_48[0x11] = 0x99;
  local_48[0x12] = 0xaa;
  local_48[0x13] = 0xbb;
  local_48[0x14] = 0xcc;
  local_48[0x15] = 0xdd;
  local_48[0x16] = 0xee;
  local_48[0x17] = 0xff;
  local_48[0x18] = '\0';
  local_48[0] = 0xde;
  local_48[1] = '\x10';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = 0;
  local_48[9] = '\x11';
  local_48[10] = '\"';
  local_48[0xb] = '3';
  local_48[0xc] = 'D';
  local_48[0xd] = 'U';
  local_48[0xe] = 'f';
  local_48[0xf] = 'w';
  local_70.input._M_len = 0x19;
  local_70.current.view._M_len = 0;
  local_70.current.view._M_str = (uchar *)0x0;
  local_70.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_70);
  local_88[0] = local_70.current.code;
  local_8c = 0xde;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array64_int64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xc10,"void compact_int64_suite::test_array64_int64_two()",local_88,&local_8c);
  local_88[0] = trial::protocol::bintoken::token::symbol::convert(local_70.current.code);
  local_8c = array;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xc11,"void compact_int64_suite::test_array64_int64_two()",local_88,&local_8c);
  vVar1 = trial::protocol::bintoken::token::symbol::convert(local_70.current.code);
  local_88[0] = end;
  if (vVar1 - null < 0xc) {
    local_88[0] = *(value *)(&DAT_00124a00 + (ulong)(vVar1 - null) * 4);
  }
  local_8c = null;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xc12,"void compact_int64_suite::test_array64_int64_two()",local_88,&local_8c);
  local_88[0] = 0x44332211;
  local_88[1] = 0x88776655;
  local_88[2] = 0xccbbaa99;
  local_88[3] = 0xffeedd;
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xc19,"void compact_int64_suite::test_array64_int64_two()",
             local_70.current.view._M_str,
             local_70.current.view._M_str + local_70.current.view._M_len,local_88,local_78);
  trial::protocol::bintoken::detail::decoder::next(&local_70);
  local_8c = local_70.current.code;
  local_74 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xc1b,"void compact_int64_suite::test_array64_int64_two()",&local_8c,&local_74);
  return;
}

Assistant:

void test_array64_int64_two()
{
    const value_type input[] = { token::code::array64_int64, 0x10, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88, 0x99, 0xAA, 0xBB, 0xCC, 0xDD, 0xEE, 0xFF, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array64_int64);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    const value_type expected[] = {
        0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88,
        0x99, 0xAA, 0xBB, 0xCC, 0xDD, 0xEE, 0xFF, 0x00
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(decoder.literal().begin(), decoder.literal().end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}